

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

long __thiscall tetgenmesh::lawsonflip3d(tetgenmesh *this,flipconstraints *fc)

{
  badface *pbVar1;
  memorypool *pmVar2;
  tetrahedron p1;
  tetrahedron p2;
  long lVar3;
  long lVar4;
  tetrahedron *pppdVar5;
  arraypool *paVar6;
  int *piVar7;
  long lVar8;
  triface *t1;
  uint uVar9;
  tetgenmesh *this_00;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  triface *unaff_R15;
  bool bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double local_c0;
  triface local_b8;
  triface local_a8;
  tetrahedron *local_98;
  uint local_90;
  tetrahedron *local_88;
  uint local_80;
  tetrahedron *local_78;
  int local_70;
  long local_68;
  long local_60;
  long local_58;
  triface *local_50;
  face checksh;
  
  lVar4 = 8;
  do {
    *(undefined8 *)((long)&local_c0 + lVar4) = 0;
    *(undefined4 *)((long)&local_b8.tet + lVar4) = 0;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x58);
  checksh.sh = (shellface *)0x0;
  checksh.shver = 0;
  local_58 = 0;
  local_60 = 0;
  do {
    if (2 < this->b->verbose) {
      printf("      Lawson flip %ld faces.\n",this->flippool->items);
    }
    local_68 = 0;
LAB_00137378:
    lVar4 = local_68;
    pbVar1 = this->flipstack;
    if (pbVar1 != (badface *)0x0) {
      local_b8.tet = (pbVar1->tt).tet;
      local_b8.ver = (pbVar1->tt).ver;
      this->flipstack = pbVar1->nextitem;
      pmVar2 = this->flippool;
      (pbVar1->tt).tet = (tetrahedron *)pmVar2->deaditemstack;
      pmVar2->deaditemstack = pbVar1;
      pmVar2->items = pmVar2->items + -1;
      if ((local_b8.tet != (tetrahedron *)0x0) && (local_b8.tet[4] != (tetrahedron)0x0)) {
        uVar11 = *(uint *)((long)local_b8.tet + (long)this->elemmarkerindex * 4);
        uVar9 = 4 << ((byte)local_b8.ver & 3);
        if ((uVar11 & uVar9) != 0) {
          *(uint *)((long)local_b8.tet + (long)this->elemmarkerindex * 4) = uVar11 & ~uVar9;
          if (local_b8.tet[7] != (tetrahedron)this->dummypoint) {
            local_a8.tet = (tetrahedron *)
                           ((ulong)local_b8.tet[local_b8.ver & 3U] & 0xfffffffffffffff0);
            local_a8.ver = fsymtbl[local_b8.ver][(uint)local_b8.tet[local_b8.ver & 3U] & 0xf];
            if (local_a8.tet[7] == (tetrahedron)this->dummypoint) {
              if (this->nonconvex != 0) {
                tspivot(this,&local_b8,&checksh);
                iVar13 = 3;
                while (bVar14 = iVar13 != 0, iVar13 = iVar13 + -1, bVar14) {
                  if (checksh.sh[(long)(checksh.shver >> 1) + 6] == (shellface)0x0) {
                    uVar9 = (uint)checksh.sh[checksh.shver >> 1] & 7;
                    uVar12 = (ulong)checksh.sh[checksh.shver >> 1] & 0xfffffffffffffff8;
                    uVar9 = checksh.sh[sorgpivot[checksh.shver]] !=
                            *(shellface *)(uVar12 + (long)sdestpivot[uVar9] * 8) ^ uVar9;
                    uVar12 = *(ulong *)(uVar12 + 0x48 + (ulong)(uVar9 & 1) * 8);
                    uVar11 = (uint)uVar12 & 0xf;
                    pppdVar5 = (tetrahedron *)(uVar12 & 0xfffffffffffffff0);
                    if (pppdVar5 != (tetrahedron *)0x0) {
                      uVar11 = stpivottbl[uVar11][uVar9];
                    }
                    if (local_b8.tet == pppdVar5) {
                      if (*(point *)(((ulong)pppdVar5[edestoppotbl[(int)uVar11] & 3] &
                                     0xfffffffffffffff0) +
                                    (long)oppopivot[fsymtbl[edestoppotbl[(int)uVar11]]
                                                    [(uint)pppdVar5[edestoppotbl[(int)uVar11] & 3] &
                                                     0xf]] * 8) == this->dummypoint) {
                        piVar7 = orgpivot;
                      }
                      else {
                        if (*(point *)(((ulong)pppdVar5[eorgoppotbl[(int)uVar11] & 3] &
                                       0xfffffffffffffff0) +
                                      (long)oppopivot[fsymtbl[eorgoppotbl[(int)uVar11]]
                                                      [(uint)pppdVar5[eorgoppotbl[(int)uVar11] & 3]
                                                       & 0xf]] * 8) != this->dummypoint) {
                          local_a8.tet = (tetrahedron *)
                                         ((ulong)pppdVar5[facepivot1[(int)uVar11]] &
                                         0xfffffffffffffff0);
                          local_a8.ver = facepivot2[(int)uVar11]
                                         [(uint)pppdVar5[facepivot1[(int)uVar11]] & 0xf];
                          local_98 = (tetrahedron *)
                                     ((ulong)local_a8.tet[facepivot1[local_a8.ver]] &
                                     0xfffffffffffffff0);
                          local_90 = facepivot2[local_a8.ver]
                                     [(uint)local_a8.tet[facepivot1[local_a8.ver]] & 0xf];
                          local_b8.tet = pppdVar5;
                          local_b8.ver = uVar11;
                          flip32(this,&local_b8,1,fc);
                          this->flip32count = this->flip32count + -1;
                          this->flip22count = this->flip22count + -1;
                          local_60 = local_60 + 1;
                          goto LAB_00137b03;
                        }
                        piVar7 = destpivot;
                      }
                      if ((*(uint *)((long)pppdVar5[piVar7[(int)uVar11]] +
                                    (long)this->pointmarkindex * 4 + 4) & 0xfffffe00) == 0x600) {
                        removevertexbyflips(this,(point)pppdVar5[piVar7[(int)uVar11]]);
                      }
                      break;
                    }
                  }
                  checksh.shver = snextpivot[checksh.shver];
                }
              }
            }
            else if ((((this->checksubfaceflag == 0) || (local_b8.tet[9] == (tetrahedron)0x0)) ||
                     (local_b8.tet[9][local_b8.ver & 3U] == (double *)0x0)) &&
                    (dVar15 = insphere_s(this,(double *)local_a8.tet[4],(double *)local_a8.tet[5],
                                         (double *)local_a8.tet[6],(double *)local_a8.tet[7],
                                         (double *)local_b8.tet[oppopivot[local_b8.ver]]),
                    dVar15 < 0.0)) {
              p1 = local_b8.tet[oppopivot[local_b8.ver]];
              p2 = local_a8.tet[oppopivot[local_a8.ver]];
              dVar16 = distance(this,(double *)p1,(double *)p2);
              iVar13 = 3;
              dVar15 = local_c0;
              while (bVar14 = iVar13 != 0, iVar13 = iVar13 + -1, bVar14) {
                dVar15 = orient3d((double *)local_b8.tet[orgpivot[local_b8.ver]],
                                  (double *)local_b8.tet[destpivot[local_b8.ver]],(double *)p1,
                                  (double *)p2);
                if (0.0 < dVar15) {
                  local_98 = local_b8.tet;
                  lVar4 = (long)local_b8.ver;
                  local_90 = esymtbl[lVar4];
                  this_00 = (tetgenmesh *)(ulong)local_90;
                  local_88 = local_a8.tet;
                  local_80 = esymtbl[local_a8.ver];
                  if ((((local_b8.tet[9] != (tetrahedron)0x0) &&
                       (this_00 = (tetgenmesh *)(ulong)(local_90 & 3),
                       local_b8.tet[9][(long)this_00] != (double *)0x0)) ||
                      ((local_a8.tet[9] != (tetrahedron)0x0 &&
                       (local_a8.tet[9][local_80 & 3] != (double *)0x0)))) &&
                     (local_c0 = dVar15,
                     dVar17 = orient3dfast(this_00,(double *)local_b8.tet[orgpivot[lVar4]],
                                           (double *)local_b8.tet[destpivot[lVar4]],(double *)p1,
                                           (double *)p2), dVar15 = local_c0,
                     ABS(dVar17) / (dVar16 * dVar16 * dVar16) < this->b->epsilon)) {
                    dVar15 = 0.0;
                    goto LAB_0013782a;
                  }
                }
                if (dVar15 <= 0.0) break;
                local_b8.ver = enexttbl[local_b8.ver];
                local_a8.ver = eprevtbl[local_a8.ver];
              }
              if (dVar15 <= 0.0) {
LAB_0013782a:
                local_c0 = dVar15;
                if (((this->checksubsegflag != 0) && (local_b8.tet[8] != (tetrahedron)0x0)) &&
                   (local_b8.tet[8][ver2edge[local_b8.ver]] != (double *)0x0)) goto LAB_00137378;
                local_b8.ver = esymtbl[local_b8.ver];
                lVar4 = 3;
                t1 = &local_b8;
                while (bVar14 = lVar4 != 0, lVar4 = lVar4 + -1, bVar14) {
                  fnext(this,t1,t1 + 1);
                  t1 = t1 + 1;
                }
                if (local_88 == local_b8.tet) {
                  flip32(this,&local_b8,0,fc);
                  iVar13 = fc->remove_ndelaunay_edge;
                  goto LAB_00137994;
                }
                lVar4 = (long)(int)local_80;
                local_78 = (tetrahedron *)((ulong)local_88[facepivot1[lVar4]] & 0xfffffffffffffff0);
                local_70 = facepivot2[lVar4][(uint)local_88[facepivot1[lVar4]] & 0xf];
                if (local_b8.tet != local_78) {
LAB_00137912:
                  arraypool::newindex(this->unflipqueue,&local_50);
                  local_50->tet = local_b8.tet;
                  lVar4 = (long)local_b8.ver;
                  local_50->ver = local_b8.ver;
                  *(tetrahedron *)&local_50[5].ver = local_b8.tet[orgpivot[lVar4]];
                  local_50[6].tet = (tetrahedron *)local_b8.tet[destpivot[lVar4]];
                  *(tetrahedron *)&local_50[6].ver = local_b8.tet[apexpivot[lVar4]];
                  unaff_R15 = local_50;
                  goto LAB_00137378;
                }
                if ((this->nonconvex == 0) ||
                   (local_88[apexpivot[lVar4]] != (tetrahedron)this->dummypoint)) {
                  if ((local_c0 != 0.0) || (NAN(local_c0))) goto LAB_00137912;
                }
                else {
                  local_c0 = 0.0;
                }
                local_b8.ver = esymtbl[local_b8.ver];
                flip23(this,&local_b8,0,fc);
                lVar4 = (long)(int)local_80;
                local_a8.tet = (tetrahedron *)
                               ((ulong)local_88[facepivot1[lVar4]] & 0xfffffffffffffff0);
                local_a8.ver = facepivot2[lVar4][(uint)local_88[facepivot1[lVar4]] & 0xf];
                local_98 = (tetrahedron *)
                           ((ulong)local_a8.tet[facepivot1[local_a8.ver]] & 0xfffffffffffffff0);
                local_90 = facepivot2[local_a8.ver]
                           [(uint)local_a8.tet[facepivot1[local_a8.ver]] & 0xf];
                flip32(this,&local_a8,
                       (uint)(local_88[apexpivot[lVar4]] == (tetrahedron)this->dummypoint),fc);
                this->flip23count = this->flip23count + -1;
                this->flip32count = this->flip32count + -1;
                this->flip44count = this->flip44count + 1;
                local_68 = local_68 + 1;
LAB_00137b03:
                iVar13 = fc->remove_ndelaunay_edge;
              }
              else {
                local_c0 = dVar15;
                flip23(this,&local_b8,0,fc);
                iVar13 = fc->remove_ndelaunay_edge;
LAB_00137994:
                local_68 = local_68 + 1;
              }
              if (iVar13 != 0) {
                this->tetprism_vol_sum = fc->tetprism_vol_sum + this->tetprism_vol_sum;
                fc->tetprism_vol_sum = 0.0;
              }
            }
          }
        }
      }
      goto LAB_00137378;
    }
    if (0 < local_68 && 2 < this->b->verbose) {
      printf("      Performed %ld flips.\n",local_68);
    }
    lVar3 = local_60;
    lVar10 = local_58 + lVar4;
    paVar6 = this->unflipqueue;
    lVar8 = paVar6->objects;
    local_58 = lVar10;
    if ((lVar8 == 0) || (lVar4 == 0)) {
      if (2 < this->b->verbose) {
        if (0 < lVar10) {
          printf("      Performed %ld flips.\n",lVar10);
        }
        if (0 < lVar3) {
          printf("      Removed %ld hull slivers.\n",lVar3);
        }
        if (0 < this->unflipqueue->objects) {
          printf("      %ld unflippable edges remained.\n");
        }
      }
      return lVar10 + lVar3;
    }
    for (lVar4 = 0; lVar4 < lVar8; lVar4 = lVar4 + 1) {
      lVar10 = (long)paVar6->objectbytes * (long)(int)(paVar6->objectsperblockmark & (uint)lVar4);
      unaff_R15 = (triface *)
                  (paVar6->toparray[(uint)lVar4 >> ((byte)paVar6->log2objectsperblock & 0x1f)] +
                  lVar10);
      lVar10 = *(long *)(paVar6->toparray[(uint)lVar4 >> ((byte)paVar6->log2objectsperblock & 0x1f)]
                        + lVar10);
      if ((((lVar10 != 0) && (*(long *)(lVar10 + 0x20) != 0)) &&
          (iVar13 = unaff_R15->ver,
          *(long *)(lVar10 + (long)orgpivot[iVar13] * 8) == *(long *)&unaff_R15[5].ver)) &&
         ((*(tetrahedron **)(lVar10 + (long)destpivot[iVar13] * 8) == unaff_R15[6].tet &&
          (*(long *)(lVar10 + (long)apexpivot[iVar13] * 8) == *(long *)&unaff_R15[6].ver)))) {
        flippush(this,&this->flipstack,unaff_R15);
        paVar6 = this->unflipqueue;
        lVar8 = paVar6->objects;
      }
    }
    paVar6->objects = 0;
    local_50 = unaff_R15;
  } while( true );
}

Assistant:

long tetgenmesh::lawsonflip3d(flipconstraints *fc)
{
  triface fliptets[5], neightet, hulltet;
  face checksh, casingout;
  badface *popface, *bface;
  point pd, pe, *pts;
  REAL sign, ori;
  REAL vol, len3;
  long flipcount, totalcount = 0l;
  long sliver_peels = 0l;
  int t1ver;
  int i;


  while (1) {

    if (b->verbose > 2) {
      printf("      Lawson flip %ld faces.\n", flippool->items);
    }
    flipcount = 0l;

    while (flipstack != (badface *) NULL) {
      // Pop a face from the stack.
      popface = flipstack;
      fliptets[0] = popface->tt;
      flipstack = flipstack->nextitem; // The next top item in stack.
      flippool->dealloc((void *) popface);

      // Skip it if it is a dead tet (destroyed by previous flips).
      if (isdeadtet(fliptets[0])) continue;
      // Skip it if it is not the same tet as we saved.
      if (!facemarked(fliptets[0])) continue;

      unmarkface(fliptets[0]);

      if (ishulltet(fliptets[0])) continue;

      fsym(fliptets[0], fliptets[1]);
      if (ishulltet(fliptets[1])) {
        if (nonconvex) {
          // Check if 'fliptets[0]' it is a hull sliver.
          tspivot(fliptets[0], checksh);
          for (i = 0; i < 3; i++) {
            if (!isshsubseg(checksh)) {
              spivot(checksh, casingout);
              //assert(casingout.sh != NULL);
              if (sorg(checksh) != sdest(casingout)) sesymself(casingout);
              stpivot(casingout, neightet);
              if (neightet.tet == fliptets[0].tet) {
                // Found a hull sliver 'neightet'. Let it be [e,d,a,b], where 
                //   [e,d,a] and [d,e,b] are hull faces.
                edestoppo(neightet, hulltet); // [a,b,e,d]
                fsymself(hulltet); // [b,a,e,#]
                if (oppo(hulltet) == dummypoint) {
                  pe = org(neightet);
                  if ((pointtype(pe) == FREEFACETVERTEX) ||
                      (pointtype(pe) == FREESEGVERTEX)) {
                    removevertexbyflips(pe);
                  }
                } else {
                  eorgoppo(neightet, hulltet); // [b,a,d,e]
                  fsymself(hulltet); // [a,b,d,#]
                  if (oppo(hulltet) == dummypoint) {
                    pd = dest(neightet);
                    if ((pointtype(pd) == FREEFACETVERTEX) ||
                        (pointtype(pd) == FREESEGVERTEX)) {
                      removevertexbyflips(pd);
                    }
                  } else {
                    // Perform a 3-to-2 flip to remove the sliver.
                    fliptets[0] = neightet;          // [e,d,a,b]
                    fnext(fliptets[0], fliptets[1]); // [e,d,b,c]
                    fnext(fliptets[1], fliptets[2]); // [e,d,c,a]
                    flip32(fliptets, 1, fc);
                    // Update counters.
                    flip32count--;
                    flip22count--;
                    sliver_peels++;
                    if (fc->remove_ndelaunay_edge) {
                      // Update the volume (must be decreased).
                      //assert(fc->tetprism_vol_sum <= 0);
                      tetprism_vol_sum += fc->tetprism_vol_sum;
                      fc->tetprism_vol_sum = 0.0; // Clear it.
                    }
                  }
                }
                break;
              } // if (neightet.tet == fliptets[0].tet)
            } // if (!isshsubseg(checksh))
            senextself(checksh);
          } // i
        } // if (nonconvex)
        continue;
      }

      if (checksubfaceflag) {
        // Do not flip if it is a subface.
        if (issubface(fliptets[0])) continue;
      }

      // Test whether the face is locally Delaunay or not.
      pts = (point *) fliptets[1].tet; 
      sign = insphere_s(pts[4], pts[5], pts[6], pts[7], oppo(fliptets[0]));

      if (sign < 0) {
        // A non-Delaunay face. Try to flip it.
        pd = oppo(fliptets[0]);
        pe = oppo(fliptets[1]);

        // Use the length of the edge [d,e] as a reference to determine
        //   a nearly degenerated new tet.
        len3 = distance(pd, pe);
        len3 = (len3 * len3 * len3);

        // Check the convexity of its three edges. Stop checking either a
        //   locally non-convex edge (ori < 0) or a flat edge (ori = 0) is
        //   encountered, and 'fliptet' represents that edge.
        for (i = 0; i < 3; i++) {
          ori = orient3d(org(fliptets[0]), dest(fliptets[0]), pd, pe);
          if (ori > 0) {
            // Avoid creating a nearly degenerated new tet at boundary.
            //   Re-use fliptets[2], fliptets[3];
            esym(fliptets[0], fliptets[2]);
            esym(fliptets[1], fliptets[3]);
            if (issubface(fliptets[2]) || issubface(fliptets[3])) {
              vol = orient3dfast(org(fliptets[0]), dest(fliptets[0]), pd, pe);
              if ((fabs(vol) / len3) < b->epsilon) {
                ori = 0.0; // Do rounding.
              }
            }
          } // Rounding check
          if (ori <= 0) break;
          enextself(fliptets[0]);
          eprevself(fliptets[1]);
        }

        if (ori > 0) {
          // A 2-to-3 flip is found.
          //   [0] [a,b,c,d], 
          //   [1] [b,a,c,e]. no dummypoint.
          flip23(fliptets, 0, fc);
          flipcount++;
          if (fc->remove_ndelaunay_edge) {
            // Update the volume (must be decreased).
            //assert(fc->tetprism_vol_sum <= 0);
            tetprism_vol_sum += fc->tetprism_vol_sum;
            fc->tetprism_vol_sum = 0.0; // Clear it.
          }
          continue;
        } else { // ori <= 0
          // The edge ('fliptets[0]' = [a',b',c',d]) is non-convex or flat,
          //   where the edge [a',b'] is one of [a,b], [b,c], and [c,a].
          if (checksubsegflag) {
            // Do not flip if it is a segment.
            if (issubseg(fliptets[0])) continue;
          }
          // Check if there are three or four tets sharing at this edge.        
          esymself(fliptets[0]); // [b,a,d,c]
          for (i = 0; i < 3; i++) {
            fnext(fliptets[i], fliptets[i+1]);
          }
          if (fliptets[3].tet == fliptets[0].tet) {
            // A 3-to-2 flip is found. (No hull tet.)
            flip32(fliptets, 0, fc); 
            flipcount++;
            if (fc->remove_ndelaunay_edge) {
              // Update the volume (must be decreased).
              //assert(fc->tetprism_vol_sum <= 0);
              tetprism_vol_sum += fc->tetprism_vol_sum;
              fc->tetprism_vol_sum = 0.0; // Clear it.
            }
            continue;
          } else {
            // There are more than 3 tets at this edge.
            fnext(fliptets[3], fliptets[4]);
            if (fliptets[4].tet == fliptets[0].tet) {
              // There are exactly 4 tets at this edge.
              if (nonconvex) {
                if (apex(fliptets[3]) == dummypoint) {
                  // This edge is locally non-convex on the hull.
                  // It can be removed by a 4-to-4 flip.                  
                  ori = 0;
                }
              } // if (nonconvex)
              if (ori == 0) {
                // A 4-to-4 flip is found. (Two hull tets may be involved.)
                // Current tets in 'fliptets':
                //   [0] [b,a,d,c] (d may be newpt)
                //   [1] [b,a,c,e]
                //   [2] [b,a,e,f] (f may be dummypoint)
                //   [3] [b,a,f,d]
                esymself(fliptets[0]); // [a,b,c,d] 
                // A 2-to-3 flip replaces face [a,b,c] by edge [e,d].
                //   This creates a degenerate tet [e,d,a,b] (tmpfliptets[0]).
                //   It will be removed by the followed 3-to-2 flip.
                flip23(fliptets, 0, fc); // No hull tet.
                fnext(fliptets[3], fliptets[1]);
                fnext(fliptets[1], fliptets[2]);
                // Current tets in 'fliptets':
                //   [0] [...]
                //   [1] [b,a,d,e] (degenerated, d may be new point).
                //   [2] [b,a,e,f] (f may be dummypoint)
                //   [3] [b,a,f,d]
                // A 3-to-2 flip replaces edge [b,a] by face [d,e,f].
                //   Hull tets may be involved (f may be dummypoint).
                flip32(&(fliptets[1]), (apex(fliptets[3]) == dummypoint), fc);
                flipcount++;
                flip23count--;
                flip32count--;
                flip44count++;
                if (fc->remove_ndelaunay_edge) {
                  // Update the volume (must be decreased).
                  //assert(fc->tetprism_vol_sum <= 0);
                  tetprism_vol_sum += fc->tetprism_vol_sum;
                  fc->tetprism_vol_sum = 0.0; // Clear it.
                }
                continue;
              } // if (ori == 0)
            }
          }
        } // if (ori <= 0)

        // This non-Delaunay face is unflippable. Save it.
        unflipqueue->newindex((void **) &bface);
        bface->tt = fliptets[0];
        bface->forg  = org(fliptets[0]);
        bface->fdest = dest(fliptets[0]);
        bface->fapex = apex(fliptets[0]);
      } // if (sign < 0)
    } // while (flipstack)

    if (b->verbose > 2) {
      if (flipcount > 0) {
        printf("      Performed %ld flips.\n", flipcount);
      }
    }
    // Accumulate the counter of flips.
    totalcount += flipcount;

    // Return if no unflippable faces left.
    if (unflipqueue->objects == 0l) break; 
    // Return if no flip has been performed.
    if (flipcount == 0l) break;

    // Try to flip the unflippable faces.
    for (i = 0; i < unflipqueue->objects; i++) {
      bface = (badface *) fastlookup(unflipqueue, i);
      if (!isdeadtet(bface->tt) && 
          (org(bface->tt) == bface->forg) &&
          (dest(bface->tt) == bface->fdest) &&
          (apex(bface->tt) == bface->fapex)) {
        flippush(flipstack, &(bface->tt));
      }
    }
    unflipqueue->restart();

  } // while (1)

  if (b->verbose > 2) {
    if (totalcount > 0) {
      printf("      Performed %ld flips.\n", totalcount);
    }
    if (sliver_peels > 0) {
      printf("      Removed %ld hull slivers.\n", sliver_peels);
    }
    if (unflipqueue->objects > 0l) {
      printf("      %ld unflippable edges remained.\n", unflipqueue->objects);
    }
  }

  return totalcount + sliver_peels;
}